

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GPMCanvas.h
# Opt level: O3

void __thiscall
adapt::gpm2::detail::GPMPlotBuffer2D<adapt::gpm2::detail::GPMGraphParam2D>::Flush
          (GPMPlotBuffer2D<adapt::gpm2::detail::GPMGraphParam2D> *this)

{
  GPMPlotBuffer2D<adapt::gpm2::detail::GPMGraphParam2D> *pGVar1;
  GPMCanvas *pGVar2;
  FILE *pFVar3;
  long *plVar4;
  NotInitialized *this_00;
  ulong *in_RCX;
  GPMPlotBuffer2D<adapt::gpm2::detail::GPMGraphParam2D> *this_01;
  array<char,_4UL> fmt;
  string c;
  array<char,_4UL> fmt_1;
  ulong *local_90;
  long local_88;
  ulong local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60 [2];
  string local_50;
  
  if (this->mCanvas != (GPMCanvas *)0x0) {
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"plot","");
    this_01 = (GPMPlotBuffer2D<adapt::gpm2::detail::GPMGraphParam2D> *)
              (this->mParam).
              super__Vector_base<adapt::gpm2::detail::GPMGraphParam2D,_std::allocator<adapt::gpm2::detail::GPMGraphParam2D>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pGVar1 = (GPMPlotBuffer2D<adapt::gpm2::detail::GPMGraphParam2D> *)
             (this->mParam).
             super__Vector_base<adapt::gpm2::detail::GPMGraphParam2D,_std::allocator<adapt::gpm2::detail::GPMGraphParam2D>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (this_01 != pGVar1) {
      do {
        PlotCommand_abi_cxx11_
                  (&local_50,this_01,(GPMGraphParam2D *)(ulong)this->mCanvas->mInMemoryDataTransfer,
                   SUB81(in_RCX,0));
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
        in_RCX = (ulong *)(plVar4 + 2);
        if ((ulong *)*plVar4 == in_RCX) {
          local_80 = *in_RCX;
          lStack_78 = plVar4[3];
          local_90 = &local_80;
        }
        else {
          local_80 = *in_RCX;
          local_90 = (ulong *)*plVar4;
        }
        local_88 = plVar4[1];
        *plVar4 = (long)in_RCX;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90);
        if (local_90 != &local_80) {
          operator_delete(local_90,local_80 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_50._M_dataplus._M_p._4_4_,local_50._M_dataplus._M_p._0_4_) !=
            &local_50.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_50._M_dataplus._M_p._4_4_,local_50._M_dataplus._M_p._0_4_),
                          local_50.field_2._M_allocated_capacity + 1);
        }
        this_01 = (GPMPlotBuffer2D<adapt::gpm2::detail::GPMGraphParam2D> *)
                  &this_01[0xb].mParam.
                   super__Vector_base<adapt::gpm2::detail::GPMGraphParam2D,_std::allocator<adapt::gpm2::detail::GPMGraphParam2D>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      } while (this_01 != pGVar1);
    }
    *(undefined1 *)((long)local_70 + local_68 + -2) = 0;
    pGVar2 = this->mCanvas;
    pFVar3 = (FILE *)pGVar2->mPipe;
    local_90 = (ulong *)CONCAT44(local_90._4_4_,0xa7325);
    local_68 = local_68 + -2;
    fprintf(pFVar3,(char *)&local_90,local_70);
    fflush(pFVar3);
    if (pGVar2->mShowCommands == true) {
      adapt::cuf::detail::PrintToStream::operator()
                ((PrintToStream *)&local_90,&std::cout,0,&local_70);
    }
    pGVar2 = this->mCanvas;
    local_88 = 0;
    local_80 = local_80 & 0xffffffffffffff00;
    local_90 = &local_80;
    std::__cxx11::string::append((char *)&local_90);
    std::__cxx11::string::append((char *)&local_90);
    std::__cxx11::string::append((char *)&local_90);
    std::__cxx11::string::append((char *)&local_90);
    std::__cxx11::string::append((char *)&local_90);
    pFVar3 = (FILE *)pGVar2->mPipe;
    local_50._M_dataplus._M_p._0_4_ = 0xa7325;
    fprintf(pFVar3,(char *)&local_50,local_90);
    fflush(pFVar3);
    if (pGVar2->mShowCommands == true) {
      adapt::cuf::detail::PrintToStream::operator()
                ((PrintToStream *)&local_50,&std::cout,0,&local_90);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    return;
  }
  this_00 = (NotInitialized *)__cxa_allocate_exception(0x28);
  adapt::cuf::NotInitialized::Exception(this_00,"Buffer is empty");
  __cxa_throw(this_00,&adapt::cuf::NotInitialized::typeinfo,adapt::cuf::Exception::~Exception);
}

Assistant:

inline void GPMPlotBuffer2D<GraphParam>::Flush()
{
	if (mCanvas == nullptr) throw NotInitialized("Buffer is empty");
	std::string c = "plot";
	for (auto& i : mParam)
	{
		c += PlotCommand(i, mCanvas->IsInMemoryDataTransferEnabled()) + ", ";
	}
	c.erase(c.end() - 2, c.end());
	mCanvas->Command(c);
	mCanvas->Command(InitCommand());
}